

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QWizardDefaultProperty>::emplace<QWizardDefaultProperty>
          (QMovableArrayOps<QWizardDefaultProperty> *this,qsizetype i,QWizardDefaultProperty *args)

{
  QWizardDefaultProperty **ppQVar1;
  QWizardDefaultProperty *pQVar2;
  Data *pDVar3;
  QWizardDefaultProperty *pQVar4;
  Data *pDVar5;
  char *pcVar6;
  qsizetype qVar7;
  Data *pDVar8;
  char *pcVar9;
  qsizetype qVar10;
  Data *pDVar11;
  char *pcVar12;
  qsizetype qVar13;
  qsizetype *pqVar14;
  bool bVar15;
  
  pDVar3 = (this->super_QGenericArrayOps<QWizardDefaultProperty>).
           super_QArrayDataPointer<QWizardDefaultProperty>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if (((this->super_QGenericArrayOps<QWizardDefaultProperty>).
         super_QArrayDataPointer<QWizardDefaultProperty>.size == i) &&
       (pQVar4 = (this->super_QGenericArrayOps<QWizardDefaultProperty>).
                 super_QArrayDataPointer<QWizardDefaultProperty>.ptr,
       (pDVar3->super_QArrayData).alloc - i !=
       ((long)((long)pQVar4 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
       -0x71c71c71c71c71c7)) {
      pDVar5 = (args->className).d.d;
      (args->className).d.d = (Data *)0x0;
      pQVar4[i].className.d.d = pDVar5;
      pcVar6 = (args->className).d.ptr;
      (args->className).d.ptr = (char *)0x0;
      pQVar4[i].className.d.ptr = pcVar6;
      qVar7 = (args->className).d.size;
      (args->className).d.size = 0;
      pQVar4[i].className.d.size = qVar7;
      pDVar5 = (args->property).d.d;
      (args->property).d.d = (Data *)0x0;
      pQVar4[i].property.d.d = pDVar5;
      pcVar6 = (args->property).d.ptr;
      (args->property).d.ptr = (char *)0x0;
      pQVar4[i].property.d.ptr = pcVar6;
      qVar7 = (args->property).d.size;
      (args->property).d.size = 0;
      pQVar4[i].property.d.size = qVar7;
      pDVar5 = (args->changedSignal).d.d;
      (args->changedSignal).d.d = (Data *)0x0;
      pQVar4[i].changedSignal.d.d = pDVar5;
      pcVar6 = (args->changedSignal).d.ptr;
      (args->changedSignal).d.ptr = (char *)0x0;
      pQVar4[i].changedSignal.d.ptr = pcVar6;
      qVar7 = (args->changedSignal).d.size;
      (args->changedSignal).d.size = 0;
      pQVar4[i].changedSignal.d.size = qVar7;
      goto LAB_005119c5;
    }
    if ((i == 0) &&
       (pQVar4 = (this->super_QGenericArrayOps<QWizardDefaultProperty>).
                 super_QArrayDataPointer<QWizardDefaultProperty>.ptr,
       (QWizardDefaultProperty *)
       ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) != pQVar4)) {
      pDVar5 = (args->className).d.d;
      (args->className).d.d = (Data *)0x0;
      pQVar4[-1].className.d.d = pDVar5;
      pcVar6 = (args->className).d.ptr;
      (args->className).d.ptr = (char *)0x0;
      pQVar4[-1].className.d.ptr = pcVar6;
      qVar7 = (args->className).d.size;
      (args->className).d.size = 0;
      pQVar4[-1].className.d.size = qVar7;
      pDVar5 = (args->property).d.d;
      (args->property).d.d = (Data *)0x0;
      pQVar4[-1].property.d.d = pDVar5;
      pcVar6 = (args->property).d.ptr;
      (args->property).d.ptr = (char *)0x0;
      pQVar4[-1].property.d.ptr = pcVar6;
      qVar7 = (args->property).d.size;
      (args->property).d.size = 0;
      pQVar4[-1].property.d.size = qVar7;
      pDVar5 = (args->changedSignal).d.d;
      (args->changedSignal).d.d = (Data *)0x0;
      pQVar4[-1].changedSignal.d.d = pDVar5;
      pcVar6 = (args->changedSignal).d.ptr;
      (args->changedSignal).d.ptr = (char *)0x0;
      pQVar4[-1].changedSignal.d.ptr = pcVar6;
      qVar7 = (args->changedSignal).d.size;
      (args->changedSignal).d.size = 0;
      pQVar4[-1].changedSignal.d.size = qVar7;
      ppQVar1 = &(this->super_QGenericArrayOps<QWizardDefaultProperty>).
                 super_QArrayDataPointer<QWizardDefaultProperty>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      goto LAB_005119c5;
    }
  }
  pDVar5 = (args->className).d.d;
  pcVar6 = (args->className).d.ptr;
  (args->className).d.d = (Data *)0x0;
  (args->className).d.ptr = (char *)0x0;
  qVar7 = (args->className).d.size;
  (args->className).d.size = 0;
  pDVar8 = (args->property).d.d;
  pcVar9 = (args->property).d.ptr;
  (args->property).d.d = (Data *)0x0;
  (args->property).d.ptr = (char *)0x0;
  qVar10 = (args->property).d.size;
  pDVar11 = (args->changedSignal).d.d;
  (args->property).d.size = 0;
  (args->changedSignal).d.d = (Data *)0x0;
  pcVar12 = (args->changedSignal).d.ptr;
  qVar13 = (args->changedSignal).d.size;
  (args->changedSignal).d.ptr = (char *)0x0;
  (args->changedSignal).d.size = 0;
  bVar15 = (this->super_QGenericArrayOps<QWizardDefaultProperty>).
           super_QArrayDataPointer<QWizardDefaultProperty>.size != 0;
  QArrayDataPointer<QWizardDefaultProperty>::detachAndGrow
            ((QArrayDataPointer<QWizardDefaultProperty> *)this,(uint)(i == 0 && bVar15),1,
             (QWizardDefaultProperty **)0x0,(QArrayDataPointer<QWizardDefaultProperty> *)0x0);
  pQVar4 = (this->super_QGenericArrayOps<QWizardDefaultProperty>).
           super_QArrayDataPointer<QWizardDefaultProperty>.ptr;
  if (i == 0 && bVar15) {
    pQVar4[-1].className.d.d = pDVar5;
    pQVar4[-1].className.d.ptr = pcVar6;
    pQVar4[-1].className.d.size = qVar7;
    pQVar4[-1].property.d.d = pDVar8;
    pQVar4[-1].property.d.ptr = pcVar9;
    pQVar4[-1].property.d.size = qVar10;
    pQVar4[-1].changedSignal.d.d = pDVar11;
    pQVar4[-1].changedSignal.d.ptr = pcVar12;
    pQVar4[-1].changedSignal.d.size = qVar13;
    (this->super_QGenericArrayOps<QWizardDefaultProperty>).
    super_QArrayDataPointer<QWizardDefaultProperty>.ptr = pQVar4 + -1;
  }
  else {
    pQVar2 = pQVar4 + i;
    memmove(pQVar2 + 1,pQVar4 + i,
            ((this->super_QGenericArrayOps<QWizardDefaultProperty>).
             super_QArrayDataPointer<QWizardDefaultProperty>.size - i) * 0x48);
    (pQVar2->className).d.d = pDVar5;
    (pQVar2->className).d.ptr = pcVar6;
    (pQVar2->className).d.size = qVar7;
    (pQVar2->property).d.d = pDVar8;
    (pQVar2->property).d.ptr = pcVar9;
    (pQVar2->property).d.size = qVar10;
    (pQVar2->changedSignal).d.d = pDVar11;
    (pQVar2->changedSignal).d.ptr = pcVar12;
    (pQVar2->changedSignal).d.size = qVar13;
  }
LAB_005119c5:
  pqVar14 = &(this->super_QGenericArrayOps<QWizardDefaultProperty>).
             super_QArrayDataPointer<QWizardDefaultProperty>.size;
  *pqVar14 = *pqVar14 + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }